

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O2

int adl_removeBank(ADL_MIDIPlayer *device,ADL_Bank *bank)

{
  long lVar1;
  long lVar2;
  int iVar3;
  
  if (bank == (ADL_Bank *)0x0 || device == (ADL_MIDIPlayer *)0x0) {
    iVar3 = -1;
  }
  else {
    if (device->adl_midiPlayer == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x142,"int adl_removeBank(ADL_MIDIPlayer *, ADL_Bank *)");
    }
    lVar1 = *(long *)((long)device->adl_midiPlayer + 0x198);
    lVar2 = *(long *)(lVar1 + 0xd0);
    BasicBankMap<OPL3::Bank>::erase
              ((BasicBankMap<OPL3::Bank> *)(lVar1 + 0xa0),*(iterator *)bank->pointer);
    iVar3 = -(uint)(*(long *)(lVar1 + 0xd0) == lVar2);
  }
  return iVar3;
}

Assistant:

ADLMIDI_EXPORT int adl_removeBank(ADL_MIDIPlayer *device, ADL_Bank *bank)
{
    if(!device || !bank)
        return -1;

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    Synth::BankMap &map = play->m_synth->m_insBanks;
    Synth::BankMap::iterator it = Synth::BankMap::iterator::from_ptrs(bank->pointer);
    size_t size = map.size();
    map.erase(it);
    return (map.size() != size) ? 0 : -1;
}